

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O1

mraa_result_t mraa_intel_edison_pwm_init_pre(int pin)

{
  mraa_result_t mVar1;
  mraa_result_t mVar2;
  mraa_gpio_context p_Var3;
  
  if (miniboard == '\x01') {
    mVar1 = mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap,1);
    return mVar1;
  }
  mVar1 = MRAA_ERROR_INVALID_RESOURCE;
  if ((uint)pin < 0x14) {
    if (((uint)plat->pins[(uint)pin].capabilities & 4) != 0) {
      p_Var3 = mraa_gpio_init_raw(outputen[(uint)pin]);
      if (p_Var3 != (mraa_gpio_context)0x0) {
        mVar2 = mraa_gpio_dir(p_Var3,MRAA_GPIO_OUT);
        if (mVar2 == MRAA_SUCCESS) {
          mVar2 = mraa_gpio_write(p_Var3,1);
          mraa_gpio_close(p_Var3);
          if (mVar2 == MRAA_SUCCESS) {
            p_Var3 = mraa_gpio_init_raw(pullup_map[(uint)pin]);
            if (p_Var3 != (mraa_gpio_context)0x0) {
              mVar2 = mraa_gpio_dir(p_Var3,MRAA_GPIO_IN);
              mraa_gpio_close(p_Var3);
              if (mVar2 == MRAA_SUCCESS) {
                mraa_intel_edison_pinmode_change(plat->pins[(uint)pin].gpio.pinmap,1);
                mVar1 = MRAA_SUCCESS;
              }
            }
          }
        }
        else {
          mraa_gpio_close(p_Var3);
        }
      }
    }
  }
  return mVar1;
}

Assistant:

mraa_result_t
mraa_intel_edison_pwm_init_pre(int pin)
{
    if (miniboard == 1) {
        return mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap, 1);
    }
    if (pin < 0 || pin > 19) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    if (!plat->pins[pin].capabilities.pwm) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    mraa_gpio_context output_e;
    output_e = mraa_gpio_init_raw(outputen[pin]);
    if (output_e == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(output_e, MRAA_GPIO_OUT) != MRAA_SUCCESS) {
        mraa_gpio_close(output_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_write(output_e, 1) != MRAA_SUCCESS) {
        mraa_gpio_close(output_e);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    mraa_gpio_close(output_e);

    mraa_gpio_context pullup_pin;
    pullup_pin = mraa_gpio_init_raw(pullup_map[pin]);
    if (pullup_pin == NULL) {
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    if (mraa_gpio_dir(pullup_pin, MRAA_GPIO_IN) != MRAA_SUCCESS) {
        mraa_gpio_close(pullup_pin);
        return MRAA_ERROR_INVALID_RESOURCE;
    }
    mraa_gpio_close(pullup_pin);
    mraa_intel_edison_pinmode_change(plat->pins[pin].gpio.pinmap, 1);

    return MRAA_SUCCESS;
}